

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

void AssertFailed(PCSTR expr)

{
  PCSTR expr_local;
  
  fprintf(_stderr,"AssertFailed:%s\n",expr);
  __assert_fail("0","/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3.cpp",
                0x3d,"void AssertFailed(PCSTR)");
}

Assistant:

void AssertFailed (PCSTR expr)
{
    fprintf (stderr, "AssertFailed:%s\n", expr);
#ifdef _WIN32 // TODO
    if (IsDebuggerPresent ()) __debugbreak ();
#endif
    assert (0);
    abort ();
}